

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseCommon.cpp
# Opt level: O1

uint __thiscall
siamese::OriginalPacket::Initialize
          (OriginalPacket *this,Allocator *allocator,SiameseOriginalPacket *packet)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint bytes;
  
  bytes = packet->DataBytes + 4;
  uVar5 = 0;
  pbVar1 = pktalloc::Allocator::Reallocate(allocator,(this->Buffer).Data,bytes,Uninitialized);
  (this->Buffer).Data = pbVar1;
  if (pbVar1 == (byte *)0x0) {
    bytes = 0;
  }
  (this->Buffer).Bytes = bytes;
  if (pbVar1 != (byte *)0x0) {
    uVar5 = packet->DataBytes;
    bVar2 = (byte)uVar5;
    if (uVar5 < 0x80) {
      *pbVar1 = bVar2;
      uVar5 = 1;
    }
    else {
      bVar3 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *pbVar1 = bVar3 | 0x80;
        pbVar1[1] = bVar2;
        uVar5 = 2;
      }
      else {
        bVar4 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *pbVar1 = bVar4 | 0xc0;
          pbVar1[1] = bVar3;
          pbVar1[2] = bVar2;
          uVar5 = 3;
        }
        else {
          *pbVar1 = (byte)(uVar5 >> 0x18) | 0xe0;
          pbVar1[1] = bVar4;
          pbVar1[2] = bVar3;
          pbVar1[3] = bVar2;
          uVar5 = 4;
        }
      }
    }
    this->HeaderBytes = uVar5;
    memcpy((this->Buffer).Data + uVar5,packet->Data,(ulong)packet->DataBytes);
    uVar5 = this->HeaderBytes;
    (this->Buffer).Bytes = packet->DataBytes + uVar5;
    this->Column = packet->PacketNum;
  }
  return uVar5;
}

Assistant:

unsigned OriginalPacket::Initialize(pktalloc::Allocator* allocator, const SiameseOriginalPacket& packet)
{
    SIAMESE_DEBUG_ASSERT(allocator && packet.Data && packet.DataBytes > 0 && packet.PacketNum < kColumnPeriod);

    // Allocate space for the packet
    const unsigned bufferSize = kMaxPacketLengthFieldBytes + packet.DataBytes;
    if (!Buffer.Initialize(allocator, bufferSize))
        return 0;

    // Serialize the packet length into the front using a compressed format
    HeaderBytes = SerializeHeader_PacketLength(packet.DataBytes, Buffer.Data);
    SIAMESE_DEBUG_ASSERT(HeaderBytes <= kMaxPacketLengthFieldBytes);

    // Copy packet data after the length
    memcpy(Buffer.Data + HeaderBytes, packet.Data, packet.DataBytes);

    Buffer.Bytes = HeaderBytes + packet.DataBytes;

    Column = packet.PacketNum;

    return HeaderBytes;
}